

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertCstrNoCaseContains
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  bool bVar1;
  TestResult *pTVar2;
  SimpleString local_d0;
  SimpleString local_c0;
  size_t local_b0;
  SimpleString local_a8;
  TestFailure local_98;
  
  local_b0 = lineNumber;
  pTVar2 = getTestResult(this);
  (*pTVar2->_vptr_TestResult[10])(pTVar2);
  if (expected != (char *)0x0 || actual != (char *)0x0) {
    if (expected == (char *)0x0 || actual == (char *)0x0) {
      SimpleString::SimpleString(&local_d0,expected);
      SimpleString::SimpleString(&local_c0,actual);
      SimpleString::SimpleString(&local_a8,text);
      ContainsFailure::ContainsFailure
                ((ContainsFailure *)&local_98,this,fileName,local_b0,&local_d0,&local_c0,&local_a8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_a8);
      SimpleString::~SimpleString(&local_c0);
      SimpleString::~SimpleString(&local_d0);
    }
    SimpleString::SimpleString((SimpleString *)&local_98,actual);
    SimpleString::SimpleString(&local_d0,expected);
    bVar1 = SimpleString::containsNoCase((SimpleString *)&local_98,&local_d0);
    SimpleString::~SimpleString(&local_d0);
    SimpleString::~SimpleString((SimpleString *)&local_98);
    if (!bVar1) {
      SimpleString::SimpleString(&local_d0,expected);
      SimpleString::SimpleString(&local_c0,actual);
      SimpleString::SimpleString(&local_a8,text);
      ContainsFailure::ContainsFailure
                ((ContainsFailure *)&local_98,this,fileName,local_b0,&local_d0,&local_c0,&local_a8);
      (*this->_vptr_UtestShell[0x26])(this,&local_98);
      TestFailure::~TestFailure(&local_98);
      SimpleString::~SimpleString(&local_a8);
      SimpleString::~SimpleString(&local_c0);
      SimpleString::~SimpleString(&local_d0);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNoCaseContains(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(actual).containsNoCase(expected))
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
}